

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuWorker.cpp
# Opt level: O3

void __thiscall xmrig::CpuWorker<1UL>::CpuWorker(CpuWorker<1UL> *this,size_t id,CpuLaunchData *data)

{
  AlgoVariant AVar1;
  VirtualMemory *this_00;
  
  Worker::Worker(&this->super_Worker,id,data->affinity,data->priority);
  (this->super_Worker).super_IWorker._vptr_IWorker = (_func_int **)&PTR__CpuWorker_001aceb0;
  (this->m_assembly).m_id = (data->assembly).m_id;
  this->m_hwAES = data->hwAES;
  AVar1 = CpuLaunchData::av(data);
  this->m_av = AVar1;
  this->m_miner = data->miner;
  memset(&(this->m_job).m_jobs[0].m_diff,0,0x99);
  memset(&(this->m_job).m_jobs[1].m_diff,0,0x99);
  (this->m_job).m_jobs[0].m_extraIters = 0;
  (this->m_job).m_jobs[1].m_seed.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_seed.m_size = 0;
  (this->m_job).m_jobs[1].m_size = 0;
  (this->m_job).m_jobs[1].m_clientId.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_clientId.m_size = 0;
  (this->m_job).m_jobs[1].m_extraNonce.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_extraNonce.m_size = 0;
  (this->m_job).m_jobs[1].m_id.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_id.m_size = 0;
  (this->m_job).m_jobs[1].m_poolWallet.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_poolWallet.m_size = 0;
  (this->m_job).m_jobs[1].m_backend = 0;
  (this->m_job).m_jobs[1].m_extraIters = 0;
  (this->m_job).m_rounds[0] = 0;
  (this->m_job).m_rounds[1] = 0;
  *(undefined8 *)((long)(this->m_job).m_rounds + 1) = 0;
  *(undefined8 *)((long)&(this->m_job).m_sequence + 1) = 0;
  memset(this->m_ctx,0,0x18c);
  this_00 = (VirtualMemory *)operator_new(0x20);
  VirtualMemory::VirtualMemory
            (this_00,0x100000,data->hugePages,true,(this->super_Worker).m_node,0x40);
  this->m_memory = this_00;
  return;
}

Assistant:

xmrig::CpuWorker<N>::CpuWorker(size_t id, const CpuLaunchData &data) :
    Worker(id, data.affinity, data.priority),
    m_assembly(data.assembly),
    m_hwAES(data.hwAES),
    m_av(data.av()),
    m_miner(data.miner),
    m_ctx()
{
    m_memory = new VirtualMemory(CnAlgo::CN_MEMORY * N, data.hugePages, true, m_node);
}